

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_first_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  bool *table;
  StringPiece characters_wanted;
  ulong local_150;
  size_type i;
  byte local_138 [8];
  bool lookup [256];
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  table = (bool *)pos;
  bVar1 = empty(this);
  if ((!bVar1) && (bVar1 = empty((StringPiece *)&this_local), !bVar1)) {
    if (s_local.ptr_ == (char *)0x1) {
      sVar2 = find_first_of(this,*(char *)&this_local->ptr_,pos);
      return sVar2;
    }
    memset(local_138,0,0x100);
    characters_wanted.length_ = (size_type)local_138;
    characters_wanted.ptr_ = s_local.ptr_;
    BuildLookupTable((stringpiece_internal *)this_local,characters_wanted,table);
    local_150 = pos;
    while( true ) {
      if (this->length_ <= local_150) {
        return 0xffffffffffffffff;
      }
      if ((local_138[(byte)this->ptr_[local_150]] & 1) != 0) break;
      local_150 = local_150 + 1;
    }
    return local_150;
  }
  return 0xffffffffffffffff;
}

Assistant:

StringPiece::size_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (empty() || s.empty()) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}